

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O3

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t chunkSize,
          CrtAllocator *baseAllocator)

{
  SharedData *pSVar1;
  CrtAllocator *pCVar2;
  
  this->chunk_capacity_ = chunkSize;
  if (baseAllocator == (CrtAllocator *)0x0) {
    baseAllocator = (CrtAllocator *)operator_new(1);
    pCVar2 = baseAllocator;
  }
  else {
    pCVar2 = (CrtAllocator *)0x0;
  }
  this->baseAllocator_ = baseAllocator;
  pSVar1 = (SharedData *)malloc(0x38);
  this->shared_ = pSVar1;
  if (pSVar1 != (SharedData *)0x0) {
    pSVar1->ownBaseAllocator = pCVar2;
    pSVar1->chunkHead = (ChunkHeader *)(pSVar1 + 1);
    pSVar1[1].chunkHead = (ChunkHeader *)0x0;
    pSVar1[1].ownBaseAllocator = (CrtAllocator *)0x0;
    pSVar1[1].refcount = 0;
    pSVar1->ownBuffer = true;
    pSVar1->refcount = 1;
    return;
  }
  __assert_fail("shared_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/rapidjson/allocators.h"
                ,0xaf,
                "rapidjson::MemoryPoolAllocator<>::MemoryPoolAllocator(size_t, BaseAllocator *) [BaseAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

explicit
    MemoryPoolAllocator(size_t chunkSize = kDefaultChunkCapacity, BaseAllocator* baseAllocator = 0) : 
        chunk_capacity_(chunkSize),
        baseAllocator_(baseAllocator ? baseAllocator : RAPIDJSON_NEW(BaseAllocator)()),
        shared_(static_cast<SharedData*>(baseAllocator_ ? baseAllocator_->Malloc(SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER) : 0))
    {
        RAPIDJSON_ASSERT(baseAllocator_ != 0);
        RAPIDJSON_ASSERT(shared_ != 0);
        if (baseAllocator) {
            shared_->ownBaseAllocator = 0;
        }
        else {
            shared_->ownBaseAllocator = baseAllocator_;
        }
        shared_->chunkHead = GetChunkHead(shared_);
        shared_->chunkHead->capacity = 0;
        shared_->chunkHead->size = 0;
        shared_->chunkHead->next = 0;
        shared_->ownBuffer = true;
        shared_->refcount = 1;
    }